

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-ascbin-cursor.c
# Opt level: O2

int coda_ascbin_cursor_goto_array_element(coda_cursor_conflict *cursor,int num_subs,long *subs)

{
  anon_struct_24_3_5e6533e2 *paVar1;
  int iVar2;
  ulong uVar3;
  char *pcVar4;
  long lVar5;
  coda_type *pcVar6;
  coda_type *pcVar7;
  long lVar8;
  long lVar9;
  int64_t var_dim;
  anon_struct_24_3_5e6533e2 *local_38;
  
  pcVar7 = (coda_type *)cursor->stack[(long)cursor->n + -1].type;
  if (99 < pcVar7->format) {
    pcVar7 = *(coda_type **)&pcVar7->type_class;
  }
  if (*(int *)&pcVar7[1].name == num_subs) {
    local_38 = cursor->stack;
    lVar5 = 0;
    for (lVar8 = 0; paVar1 = local_38, lVar8 < num_subs; lVar8 = lVar8 + 1) {
      pcVar4 = (&pcVar7[1].description)[lVar8];
      if (((&pcVar7[1].description)[lVar8] == (char *)0xffffffffffffffff) &&
         (iVar2 = coda_expression_eval_integer
                            ((coda_expression *)(&pcVar7[2].bit_size)[lVar8],cursor,&var_dim),
         pcVar4 = (char *)var_dim, iVar2 != 0)) {
        coda_add_error_message(" for dim[%d] expression",lVar8);
        coda_cursor_add_to_error_message(cursor);
        goto LAB_0014734d;
      }
      lVar9 = subs[lVar8];
      if ((lVar9 < 0) || ((long)pcVar4 <= lVar9)) {
        coda_set_error(-0x6b,"array index (%ld) exceeds array range [0:%ld)");
        goto LAB_0014734d;
      }
      if (lVar8 == 0) {
        pcVar4 = (char *)0x1;
      }
      lVar5 = (long)pcVar4 * lVar5 + lVar9;
      num_subs = *(int *)&pcVar7[1].name;
    }
    iVar2 = cursor->n;
    uVar3 = (ulong)(iVar2 + 1U);
    cursor->n = iVar2 + 1U;
    lVar8 = local_38[(long)iVar2 + -1].bit_offset;
    local_38[iVar2].bit_offset = lVar8;
    pcVar6 = *(coda_type **)(pcVar7 + 1);
    if (pcVar6->bit_size < 0) {
      lVar9 = 0;
      lVar8 = 0;
      if (0 < lVar5) {
        lVar8 = lVar5;
      }
      for (; lVar8 != lVar9; lVar9 = lVar9 + 1) {
        iVar2 = (int)uVar3 + -1;
        paVar1[iVar2].type = (coda_dynamic_type_struct *)*(coda_type **)(pcVar7 + 1);
        paVar1[iVar2].index = lVar9;
        iVar2 = coda_cursor_get_bit_size(cursor,&var_dim);
        if (iVar2 != 0) {
          cursor->n = cursor->n + -1;
          goto LAB_0014734d;
        }
        uVar3 = (ulong)cursor->n;
        paVar1[uVar3 - 1].bit_offset = paVar1[uVar3 - 1].bit_offset + var_dim;
      }
      pcVar6 = *(coda_type **)(pcVar7 + 1);
      iVar2 = (int)uVar3 + -1;
    }
    else {
      local_38[iVar2].bit_offset = pcVar6->bit_size * lVar5 + lVar8;
    }
    paVar1[iVar2].type = (coda_dynamic_type_struct *)pcVar6;
    paVar1[iVar2].index = lVar5;
    iVar2 = 0;
  }
  else {
    coda_set_error(-0x6a,"number of dimensions argument (%d) does not match rank of  array (%d)");
LAB_0014734d:
    iVar2 = -1;
  }
  return iVar2;
}

Assistant:

int coda_ascbin_cursor_goto_array_element(coda_cursor *cursor, int num_subs, const long subs[])
{
    coda_type_array *array;
    long offset_elements;
    long i;

    array = (coda_type_array *)coda_get_type_for_dynamic_type(cursor->stack[cursor->n - 1].type);

    /* check the number of dimensions */
    if (num_subs != array->num_dims)
    {
        coda_set_error(CODA_ERROR_ARRAY_NUM_DIMS_MISMATCH, "number of dimensions argument (%d) does not match rank of "
                       " array (%d)", num_subs, array->num_dims);
        return -1;
    }

    /* check the dimensions... */
    offset_elements = 0;
    for (i = 0; i < array->num_dims; i++)
    {
        long dim;

        if (array->dim[i] == -1)
        {
            int64_t var_dim;

            if (coda_expression_eval_integer(array->dim_expr[i], cursor, &var_dim) != 0)
            {
                coda_add_error_message(" for dim[%d] expression", i);
                coda_cursor_add_to_error_message(cursor);
                return -1;
            }
            dim = (long)var_dim;
        }
        else
        {
            dim = array->dim[i];
        }

        if (subs[i] < 0 || subs[i] >= dim)
        {
            coda_set_error(CODA_ERROR_ARRAY_OUT_OF_BOUNDS, "array index (%ld) exceeds array range [0:%ld)", subs[i],
                           dim);
            return -1;
        }
        if (i > 0)
        {
            offset_elements *= dim;
        }
        offset_elements += subs[i];
    }

    cursor->n++;
    cursor->stack[cursor->n - 1].bit_offset = cursor->stack[cursor->n - 2].bit_offset;

    if (array->base_type->bit_size >= 0)
    {
        /* if the array base type is simple, do a calculated index calculation. */
        cursor->stack[cursor->n - 1].bit_offset += offset_elements * array->base_type->bit_size;
    }
    else        /* not a simple base type, so walk the elements. */
    {
        for (i = 0; i < offset_elements; i++)
        {
            int64_t bit_size;

            cursor->stack[cursor->n - 1].type = (coda_dynamic_type *)array->base_type;
            cursor->stack[cursor->n - 1].index = i;
            if (coda_cursor_get_bit_size(cursor, &bit_size) != 0)
            {
                cursor->n--;
                return -1;
            }
            cursor->stack[cursor->n - 1].bit_offset += bit_size;
        }
    }
    cursor->stack[cursor->n - 1].type = (coda_dynamic_type *)array->base_type;
    cursor->stack[cursor->n - 1].index = offset_elements;

    return 0;
}